

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

SAM_RG * sam_hdr_find_rg(SAM_hdr *hdr,char *rg)

{
  khint_t kVar1;
  SAM_RG *local_28;
  khint_t k;
  char *rg_local;
  SAM_hdr *hdr_local;
  
  kVar1 = kh_get_m_s2i(hdr->rg_hash,rg);
  if (kVar1 == hdr->rg_hash->n_buckets) {
    local_28 = (SAM_RG *)0x0;
  }
  else {
    local_28 = hdr->rg + hdr->rg_hash->vals[kVar1];
  }
  return local_28;
}

Assistant:

SAM_RG *sam_hdr_find_rg(SAM_hdr *hdr, const char *rg) {
    khint_t k = kh_get(m_s2i, hdr->rg_hash, rg);
    return k == kh_end(hdr->rg_hash)
	? NULL
	: &hdr->rg[kh_val(hdr->rg_hash, k)];
}